

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

char * jsonp_strndup(char *str,size_t len)

{
  char *__dest;
  
  if (len + 1 == 0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = (char *)(*do_malloc)(len + 1);
  }
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    memcpy(__dest,str,len);
    __dest[len] = '\0';
  }
  return __dest;
}

Assistant:

char *jsonp_strndup(const char *str, size_t len)
{
    char *new_str;

    new_str = jsonp_malloc(len + 1);
    if(!new_str)
        return NULL;

    memcpy(new_str, str, len);
    new_str[len] = '\0';
    return new_str;
}